

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_tointeger(TValue *obj,lua_Integer *p,int mode)

{
  double __x;
  size_t sVar1;
  ulong local_60;
  byte local_49;
  double local_48;
  lua_Number f;
  lua_Number n;
  TValue v;
  int mode_local;
  lua_Integer *p_local;
  TValue *obj_local;
  
  v._12_4_ = mode;
  p_local = (lua_Integer *)obj;
  while( true ) {
    if ((int)p_local[1] == 3) {
      __x = (double)*p_local;
      local_48 = floor(__x);
      if ((__x != local_48) || (NAN(__x) || NAN(local_48))) {
        if (v._12_4_ == 0) {
          return 0;
        }
        if (1 < (int)v._12_4_) {
          local_48 = local_48 + 1.0;
        }
      }
      local_49 = 0;
      if ((-9.223372036854776e+18 <= local_48) && (local_49 = 0, local_48 < 9.223372036854776e+18))
      {
        *p = (long)local_48;
        local_49 = 1;
      }
      return (uint)local_49;
    }
    if ((int)p_local[1] == 0x13) {
      *p = *p_local;
      return 1;
    }
    if ((*(uint *)(p_local + 1) & 0xf) != 4) {
      return 0;
    }
    sVar1 = luaO_str2num((char *)(*p_local + 0x18),(TValue *)&n);
    if (*(char *)(*p_local + 8) == '\x04') {
      local_60 = (ulong)*(byte *)(*p_local + 0xb);
    }
    else {
      local_60 = *(ulong *)(*p_local + 0x10);
    }
    if (sVar1 != local_60 + 1) break;
    p_local = (lua_Integer *)&n;
  }
  return 0;
}

Assistant:

int luaV_tointeger (const TValue *obj, lua_Integer *p, int mode) {
  TValue v;
 again:
  if (ttisfloat(obj)) {
    lua_Number n = fltvalue(obj);
    lua_Number f = l_floor(n);
    if (n != f) {  /* not an integral value? */
      if (mode == 0) return 0;  /* fails if mode demands integral value */
      else if (mode > 1)  /* needs ceil? */
        f += 1;  /* convert floor to ceil (remember: n != f) */
    }
    return lua_numbertointeger(f, p);
  }
  else if (ttisinteger(obj)) {
    *p = ivalue(obj);
    return 1;
  }
  else if (cvt2num(obj) &&
            luaO_str2num(svalue(obj), &v) == vslen(obj) + 1) {
    obj = &v;
    goto again;  /* convert result from 'luaO_str2num' to an integer */
  }
  return 0;  /* conversion failed */
}